

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v11::detail::vformat_to(buffer<char> *buf,string_view fmt,format_args args,locale_ref loc)

{
  basic_appender<char> out;
  _func_void_void_ptr_parse_context<char>_ptr_context_ptr *p_Var1;
  type tVar2;
  float value;
  basic_string_view<char> fmt_00;
  format_specs specs;
  undefined1 in_stack_00000008 [16];
  undefined1 local_50 [4];
  char acStack_4c [4];
  undefined1 uStack_48;
  undefined7 uStack_47;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aStack_40;
  locale_ref local_38;
  format_handler<char> *local_30;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_28;
  void *local_20;
  parse_context<char> local_18;
  
  local_28 = args.field_1;
  local_30 = (format_handler<char> *)args.desc_;
  if (((char *)fmt.size_ == (char *)0x2) && (*(short *)fmt.data_ == 0x7d7b)) {
    if ((long)local_30 < 0) {
      if ((int)(type)args.desc_ < 1) goto LAB_0023940f;
      tVar2 = (local_28.args_)->type_;
    }
    else {
      tVar2 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0)
      goto LAB_0023940f;
    }
    if (0xe < tVar2 - int_type) {
LAB_0023940f:
      report_error("argument not found");
    }
    out.container = *(buffer<char> **)&(local_28.values_)->field_0;
    p_Var1 = ((local_28.values_)->field_0).custom.format;
    value = SUB84(out.container,0);
    switch(tVar2) {
    case int_type:
      write<char,_fmt::v11::basic_appender<char>,_int,_0>((basic_appender<char>)buf,(int)value);
      return;
    case uint_type:
      write<char,_fmt::v11::basic_appender<char>,_unsigned_int,_0>
                ((basic_appender<char>)buf,(uint)value);
      return;
    case long_long_type:
      write<char,_fmt::v11::basic_appender<char>,_long_long,_0>
                ((basic_appender<char>)buf,(longlong)out.container);
      return;
    case ulong_long_type:
      write<char,_fmt::v11::basic_appender<char>,_unsigned_long_long,_0>
                ((basic_appender<char>)buf,(unsigned_long_long)out.container);
      return;
    case int128_type:
      write<char,_fmt::v11::basic_appender<char>,___int128,_0>
                ((detail *)buf,out,(__int128)in_stack_00000008);
      return;
    case uint128_type:
      write<char,_fmt::v11::basic_appender<char>,_unsigned___int128,_0>
                ((detail *)buf,out,(unsigned___int128)in_stack_00000008);
      return;
    case bool_type:
      local_50 = (undefined1  [4])0x8000;
      uStack_47 = 0xffffffff000000;
      acStack_4c[0] = ' ';
      acStack_4c[1] = '\0';
      acStack_4c[2] = '\0';
      acStack_4c[3] = '\0';
      uStack_48 = 0;
      write<char,_fmt::v11::basic_appender<char>,_bool,_0>
                ((basic_appender<char>)buf,(bool)((byte)out.container & 1),(format_specs *)local_50,
                 (locale_ref)0x0);
      break;
    case char_type:
      write<char,fmt::v11::basic_appender<char>>((basic_appender<char>)buf,(byte)out.container);
      return;
    case float_type:
      write<char,_fmt::v11::basic_appender<char>,_float,_0>((basic_appender<char>)buf,value);
      return;
    case double_type:
      write<char,_fmt::v11::basic_appender<char>,_double,_0>
                ((basic_appender<char>)buf,(double)out.container);
      return;
    case last_numeric_type:
      specs.width = 0;
      specs.precision = -1;
      specs.super_basic_specs.data_ = 0x8000;
      specs.super_basic_specs.fill_data_[0] = ' ';
      specs.super_basic_specs.fill_data_[1] = '\0';
      specs.super_basic_specs.fill_data_[2] = '\0';
      specs.super_basic_specs.fill_data_[3] = '\0';
      write_float<char,fmt::v11::basic_appender<char>,long_double>
                ((basic_appender<char>)buf,((local_28.values_)->field_0).long_double_value,specs,
                 (locale_ref)0x0);
      break;
    case cstring_type:
      write<char,fmt::v11::basic_appender<char>>((basic_appender<char>)buf,(char *)out.container);
      return;
    case string_type:
      copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                ((char *)out.container,(char *)(p_Var1 + (long)out.container),
                 (basic_appender<char>)buf);
      return;
    case pointer_type:
      local_50 = (undefined1  [4])0x8000;
      uStack_47 = 0xffffffff000000;
      acStack_4c[0] = ' ';
      acStack_4c[1] = '\0';
      acStack_4c[2] = '\0';
      acStack_4c[3] = '\0';
      uStack_48 = 0;
      write_ptr<char,fmt::v11::basic_appender<char>,unsigned_long>
                ((basic_appender<char>)buf,(unsigned_long)out.container,(format_specs *)local_50);
      break;
    case custom_type:
      local_18.fmt_.data_ = (char *)0x0;
      local_18.fmt_.size_ = 0;
      local_18.next_arg_id_ = 0;
      uStack_48 = 0;
      uStack_47 = 0;
      aStack_40.values_ = (value<fmt::v11::context> *)0x0;
      local_38.locale_ = (void *)0x0;
      _local_50 = (basic_specs)buf;
      (*p_Var1)(out.container,&local_18,(context *)local_50);
    }
  }
  else {
    local_50 = fmt.data_._0_4_;
    acStack_4c = fmt.data_._4_4_;
    uStack_48 = (undefined1)fmt.size_;
    uStack_47 = fmt.size_._1_7_;
    aStack_40.args_ = aStack_40.args_ & 0xffffffff00000000;
    fmt_00.size_ = (size_t)local_50;
    fmt_00.data_ = (char *)fmt.size_;
    local_38.locale_ = buf;
    local_20 = loc.locale_;
    parse_format_string<char,fmt::v11::detail::format_handler<char>>
              ((detail *)fmt.data_,fmt_00,local_30);
  }
  return;
}

Assistant:

FMT_FUNC void vformat_to(buffer<char>& buf, string_view fmt, format_args args,
                         locale_ref loc) {
  auto out = appender(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}"))
    return args.get(0).visit(default_arg_formatter<char>{out});
  parse_format_string(
      fmt, format_handler<char>{parse_context<char>(fmt), {out, args, loc}});
}